

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::minimal_simplex_with_same_filtration
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Simplex_handle *sh)

{
  type_conflict3 tVar1;
  Filtration_value *pFVar2;
  reference other;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  *in_RDX;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_390;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_388;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_380;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  b;
  undefined1 local_370 [8];
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __end0;
  undefined1 local_298 [8];
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __begin0;
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  local_1c8;
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  *local_38;
  Boundary_simplex_range *__range2;
  Filtration_value local_28;
  Filtration_value filt;
  Simplex_handle *sh_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  
  sh_local = sh;
  this_local = this;
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&__range2,in_RDX);
  pFVar2 = filtration_((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)&__range2);
  local_28 = *pFVar2;
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)&__begin0.st_,in_RDX);
  boundary_simplex_range<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>>
            ((Boundary_simplex_range *)&local_1c8,
             (Simplex_tree<Gudhi::Simplex_tree_options_default> *)sh,
             (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
              *)&__begin0.st_);
  local_38 = &local_1c8;
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
           *)local_298,&local_1c8);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
         *)local_370,local_38);
  do {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long>
                        *)local_298,
                       (iterator_facade<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long>
                        *)local_370);
    if (!tVar1) {
      b.m_ptr._4_4_ = 2;
LAB_001f71e5:
      Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
      ::~Simplex_tree_boundary_simplex_iterator
                ((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                  *)local_370);
      Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
      ::~Simplex_tree_boundary_simplex_iterator
                ((Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                  *)local_298);
      boost::
      iterator_range<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
      ::~iterator_range((iterator_range<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                         *)&local_1c8);
      if (b.m_ptr._4_4_ != 1) {
        boost::container::
        vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
        ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                        *)this,in_RDX);
      }
      return (Simplex_handle)
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
              *)this;
    }
    other = boost::iterators::detail::
            iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
            ::operator*((iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
                         *)local_298);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_380,other);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_388,&local_380);
    pFVar2 = filtration_(&local_388);
    if ((*pFVar2 == local_28) && (!NAN(*pFVar2) && !NAN(local_28))) {
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::vec_iterator(&local_390,&local_380);
      minimal_simplex_with_same_filtration(this,sh);
      b.m_ptr._4_4_ = 1;
      goto LAB_001f71e5;
    }
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_&,_long,_false,_false>
                  *)local_298);
  } while( true );
}

Assistant:

Simplex_handle minimal_simplex_with_same_filtration(Simplex_handle sh) const {
    auto filt = filtration_(sh);
    // Naive implementation, it can be sped up.
    for(auto b : boundary_simplex_range(sh))
      if(filtration_(b) == filt)
        return minimal_simplex_with_same_filtration(b);
    return sh; // None of its faces has the same filtration.
  }